

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# videomenu.cpp
# Opt level: O1

void M_SetDefaultMode(void)

{
  UCVarValue value;
  UCVarValue value_00;
  UCVarValue value_01;
  
  value._4_4_ = 0;
  value.Int = screen->VideoWidth;
  FBaseCVar::SetGenericRep(&vid_defwidth.super_FBaseCVar,value,CVAR_Int);
  value_00._4_4_ = 0;
  value_00.Int = screen->VideoHeight;
  FBaseCVar::SetGenericRep(&vid_defheight.super_FBaseCVar,value_00,CVAR_Int);
  value_01._4_4_ = 0;
  value_01.Int = DisplayBits;
  FBaseCVar::SetGenericRep(&vid_defbits.super_FBaseCVar,value_01,CVAR_Int);
  testingmode = 0;
  SetModesMenu(screen->VideoWidth,screen->VideoHeight,DisplayBits);
  return;
}

Assistant:

void M_SetDefaultMode ()
{
	// Make current resolution the default
	vid_defwidth = screen->VideoWidth;
	vid_defheight = screen->VideoHeight;
	vid_defbits = DisplayBits;
	testingmode = 0;
	SetModesMenu (screen->VideoWidth, screen->VideoHeight, DisplayBits);
}